

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

void __thiscall OpenMD::OpenMDBitSet::resize(OpenMDBitSet *this,size_t nbits)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_19;
  
  uVar1 = (ulong)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->bitset_,nbits,false);
  if (uVar1 < nbits) {
    __first.super__Bit_iterator_base._M_p =
         ((long)uVar1 / 0x40) * 8 +
         (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
         (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
    p_Var4 = &(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl;
    uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last.super__Bit_iterator_base._M_offset = uVar3;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    local_19 = false;
    __first.super__Bit_iterator_base._M_offset = (uint)uVar1 & 0x3f;
    __first.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._12_4_ = 0;
    std::__fill_a1(__first,__last,&local_19);
  }
  return;
}

Assistant:

void OpenMDBitSet::resize(size_t nbits) {
    size_t oldSize = size();
    bitset_.resize(nbits);
    if (nbits > oldSize) {
      std::fill(bitset_.begin() + oldSize, bitset_.end(), false);
    }
  }